

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestPathVariables::Run(ParserTestPathVariables *this)

{
  Test *pTVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  StringPiece local_38;
  StringPiece local_28;
  int local_14;
  ParserTestPathVariables *pPStack_10;
  int fail_count;
  ParserTestPathVariables *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\ndir = out\nbuild $dir/exe: cat src\n");
  iVar2 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar3) {
    StringPiece::StringPiece(&local_28,"$dir/exe");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_28);
    testing::Test::Check
              (pTVar1,(bool)((pNVar4 != (Node *)0x0 ^ 0xffU) & 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x121,"state.LookupNode(\"$dir/exe\")");
    pTVar1 = g_current_test;
    StringPiece::StringPiece(&local_38,"out/exe");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_38);
    testing::Test::Check
              (pTVar1,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x122,"state.LookupNode(\"out/exe\")");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, PathVariables) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"dir = out\n"
"build $dir/exe: cat src\n"));

  EXPECT_FALSE(state.LookupNode("$dir/exe"));
  EXPECT_TRUE(state.LookupNode("out/exe"));
}